

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O2

PSprite __thiscall
DataSourceBase::get_sprite(DataSourceBase *this,Resource res,size_t index,Color *color)

{
  element_type *peVar1;
  uint uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 in_register_00000034;
  uint *in_R8;
  PSprite PVar4;
  PSprite mask;
  PSprite image;
  MaskImage ms;
  __shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2> local_60;
  _Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_> local_50;
  
  uVar2 = Data::get_resource_count((Resource)index);
  if (color < (Color *)(ulong)uVar2) {
    (**(code **)(*(long *)CONCAT44(in_register_00000034,res) + 0x40))
              (&local_50,(long *)CONCAT44(in_register_00000034,res),index & 0xffffffff,color);
    std::__shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,
               (__shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2> *)
               &local_50.super__Head_base<0UL,_std::shared_ptr<Data::Sprite>,_false>);
    std::__shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,(__shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
    _Var3._M_pi = local_78._M_refcount._M_pi;
    if (local_88._M_ptr == (element_type *)0x0) {
      local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_Source)._vptr_Source = (_func_int **)local_78._M_ptr;
      (this->path)._M_dataplus._M_p = (pointer)_Var3._M_pi;
      local_78._M_ptr = (element_type *)0x0;
    }
    else {
      (*(local_88._M_ptr)->_vptr_Sprite[10])(local_88._M_ptr,(ulong)*in_R8);
      peVar1 = local_88._M_ptr;
      if (local_78._M_ptr == (element_type *)0x0) {
        (this->super_Source)._vptr_Source = (_func_int **)local_88._M_ptr;
        (this->path)._M_dataplus._M_p = (pointer)local_88._M_refcount._M_pi;
      }
      else {
        std::__shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,&local_78);
        (*peVar1->_vptr_Sprite[0xd])(peVar1,&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        (this->super_Source)._vptr_Source = (_func_int **)local_88._M_ptr;
        (this->path)._M_dataplus._M_p = (pointer)local_88._M_refcount._M_pi;
      }
      local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_88._M_ptr = (element_type *)0x0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    std::_Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>::
    ~_Tuple_impl(&local_50);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    (this->super_Source)._vptr_Source = (_func_int **)0x0;
    (this->path)._M_dataplus._M_p = (pointer)0x0;
    _Var3._M_pi = extraout_RDX;
  }
  PVar4.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  PVar4.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PSprite)PVar4.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Data::PSprite
DataSourceBase::get_sprite(Data::Resource res, size_t index,
                           const Data::Sprite::Color &color) {
  if (index >= Data::get_resource_count(res)) {
    return nullptr;
  }

  Data::MaskImage ms = get_sprite_parts(res, index);
  Data::PSprite mask = std::get<0>(ms);
  Data::PSprite image = std::get<1>(ms);

  if (mask) {
    mask->fill_masked(color);
    if (image) {
      mask->blend(image);
      return mask;
    }
    return mask;
  }

  return image;
}